

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix * __thiscall
Matrix::GetInverse(Matrix *__return_storage_ptr__,Matrix *this,ChoiceType choice_type)

{
  bool bVar1;
  ostream *poVar2;
  LinearSystem inverser;
  Matrix MStack_178;
  LinearSystem local_158;
  
  if (this->n_ == this->m_) {
    Identity(&MStack_178,this->n_);
    LinearSystem::LinearSystem(&local_158,this,&MStack_178,Standard);
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::~vector(&MStack_178.elements_);
    bVar1 = LinearSystem::RunGauss(&local_158,choice_type);
    poVar2 = operator<<((ostream *)&Options::writer_abi_cxx11_,&local_158);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (bVar1) {
      LinearSystem::GetSolutionMatrix(__return_storage_ptr__,&local_158);
    }
    else {
      Matrix(__return_storage_ptr__,this->n_,this->n_,0);
    }
    LinearSystem::~LinearSystem(&local_158);
    return __return_storage_ptr__;
  }
  __assert_fail("n_ == m_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/matrix.cpp"
                ,0x1a9,"Matrix Matrix::GetInverse(Options::ChoiceType) const");
}

Assistant:

Matrix Matrix::GetInverse(Options::ChoiceType choice_type) const {
  assert(n_ == m_);
  LinearSystem inverser(*this, Identity(n_));
  bool linear_independent = inverser.RunGauss(choice_type);
  Options::writer << inverser << std::endl;
  if (!linear_independent) {
    return Matrix(n_, n_);
  }

  return inverser.GetSolutionMatrix();
}